

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageUtil.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::TestTexture1DArray::TestTexture1DArray
          (TestTexture1DArray *this,TextureFormat *format,int width,int arraySize)

{
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> local_48;
  int local_20;
  int local_1c;
  int arraySize_local;
  int width_local;
  TextureFormat *format_local;
  TestTexture1DArray *this_local;
  
  local_20 = arraySize;
  local_1c = width;
  _arraySize_local = format;
  format_local = (TextureFormat *)this;
  TestTexture::TestTexture(&this->super_TestTexture,format,width,1,arraySize);
  (this->super_TestTexture)._vptr_TestTexture = (_func_int **)&PTR__TestTexture1DArray_016a43c8;
  tcu::Texture1DArray::Texture1DArray(&this->m_texture,_arraySize_local,local_1c,local_20);
  allocateLevels<tcu::Texture1DArray>(&this->m_texture);
  getLevelsVector<tcu::Texture1DArray>(&local_48,&this->m_texture);
  TestTexture::populateLevels(&this->super_TestTexture,&local_48);
  std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::~vector(&local_48);
  return;
}

Assistant:

TestTexture1DArray::TestTexture1DArray (const tcu::TextureFormat& format, int width, int arraySize)
	: TestTexture	(format, width, 1, arraySize)
	, m_texture		(format, width, arraySize)
{
	allocateLevels(m_texture);
	TestTexture::populateLevels(getLevelsVector(m_texture));
}